

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autolink.cc
# Opt level: O1

base_learner * autolink_setup(options_i *options,vw *all)

{
  int iVar1;
  autolink *dat;
  base_learner *l;
  single_learner *base;
  learner<autolink,_example> *plVar2;
  uint32_t *puVar3;
  size_type __dnew;
  option_group_definition new_options;
  long local_210;
  option_group_definition local_208;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  string local_1b0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined1 local_178;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<unsigned_int> local_d0;
  
  dat = calloc_or_throw<autolink>(1);
  dat->d = 0;
  dat->stride_shift = 0;
  local_180 = 0x6b6e696c6f747541;
  local_188 = 8;
  local_178 = 0;
  local_208.m_name._M_dataplus._M_p = (pointer)&local_208.m_name.field_2;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char*>((string *)&local_208,&local_180);
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  local_1b0.field_2._M_allocated_capacity = 0x6b6e696c6f747561;
  local_1b0._M_string_length = 8;
  local_1b0.field_2._M_local_buf[8] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_170,&local_1b0,&dat->d);
  local_100 = true;
  local_210 = 0x26;
  local_1d0 = local_1c0;
  local_1d0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)&local_210);
  local_1c0[0] = local_210;
  local_1d0[2] = 0x746977206e6f6974;
  local_1d0[3] = 0x6f6e796c6f702068;
  *local_1d0 = 0x6c20657461657263;
  local_1d0[1] = 0x636e7566206b6e69;
  builtin_strncpy((char *)((long)local_1d0 + 0x1e),"nomial d",8);
  local_1c8 = local_210;
  *(char *)((long)local_1d0 + local_210) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_170);
  VW::config::option_group_definition::add<unsigned_int>(&local_208,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d20f8;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  local_170._0_8_ = &PTR__typed_option_002d20f8;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_208);
  local_170._16_8_ = 0x6b6e696c6f747561;
  local_170._8_8_ = (pointer)0x8;
  local_170[0x18] = '\0';
  local_170._0_8_ = local_170 + 0x10;
  iVar1 = (*options->_vptr_options_i[1])(options,local_170);
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar1 == '\0') {
    plVar2 = (learner<autolink,_example> *)0x0;
  }
  else {
    puVar3 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar3 = &(all->weights).sparse_weights._stride_shift;
    }
    dat->stride_shift = *puVar3;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::learner<autolink,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,predict_or_learn<true>,predict_or_learn<false>,1,
                        *(prediction_type_t *)(base + 0xd0));
    dat = (autolink *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_208.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_name._M_dataplus._M_p != &local_208.m_name.field_2) {
    operator_delete(local_208.m_name._M_dataplus._M_p);
  }
  if (dat != (autolink *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* autolink_setup(options_i& options, vw& all)
{
  free_ptr<autolink> data = scoped_calloc_or_throw<autolink>();
  option_group_definition new_options("Autolink");
  new_options.add(make_option("autolink", data->d).keep().help("create link function with polynomial d"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("autolink"))
    return nullptr;

  data->stride_shift = all.weights.stride_shift();

  LEARNER::learner<autolink, example>& ret =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);

  return make_base(ret);
}